

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_biquad_process_pcm_frames
                    (ma_biquad *pBQ,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  ma_uint32 channels;
  ma_uint32 c;
  ma_int32 y_1;
  ma_int32 x_1;
  ma_int32 r2_1;
  ma_int32 r1_1;
  ma_int32 a2_1;
  ma_int32 a1_1;
  ma_int32 b2_1;
  ma_int32 b1_1;
  ma_int32 b0_1;
  ma_uint32 channels_1;
  ma_uint32 c_1;
  int local_e4;
  undefined2 local_e0;
  int local_dc;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  uint local_b4;
  ma_result local_90;
  ma_int16 *pX_1;
  ma_int16 *pY_1;
  float *pX;
  float *pY;
  ma_uint32 n;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_biquad *pBQ_local;
  float y;
  float x;
  float r2;
  float r1;
  float a2;
  float a1;
  float b2;
  float b1;
  float b0;
  
  if (((pBQ == (ma_biquad *)0x0) || (pFramesOut == (void *)0x0)) || (pFramesIn == (void *)0x0)) {
    local_90 = MA_INVALID_ARGS;
  }
  else {
    if (pBQ->format == ma_format_f32) {
      local_c8 = pFramesIn;
      local_c0 = pFramesOut;
      for (local_b4 = 0; local_b4 < frameCount; local_b4 = local_b4 + 1) {
        uVar8 = pBQ->channels;
        fVar1 = (pBQ->b0).f32;
        fVar2 = (pBQ->b1).f32;
        fVar3 = (pBQ->b2).f32;
        fVar4 = (pBQ->a1).f32;
        fVar5 = (pBQ->a2).f32;
        for (pY_1._4_4_ = 0; pY_1._4_4_ < uVar8; pY_1._4_4_ = pY_1._4_4_ + 1) {
          fVar6 = pBQ->pR2[pY_1._4_4_].f32;
          fVar7 = *(float *)((long)local_c8 + (ulong)pY_1._4_4_ * 4);
          fVar18 = fVar1 * fVar7 + pBQ->pR1[pY_1._4_4_].f32;
          *(float *)((long)local_c0 + (ulong)pY_1._4_4_ * 4) = fVar18;
          pBQ->pR1[pY_1._4_4_].f32 = fVar2 * fVar7 + -(fVar4 * fVar18) + fVar6;
          pBQ->pR2[pY_1._4_4_].f32 = fVar3 * fVar7 + -(fVar5 * fVar18);
        }
        local_c0 = (void *)((long)local_c0 + (ulong)pBQ->channels * 4);
        local_c8 = (void *)((long)local_c8 + (ulong)pBQ->channels * 4);
      }
    }
    else {
      if (pBQ->format != ma_format_s16) {
        return MA_INVALID_ARGS;
      }
      local_d8 = pFramesIn;
      local_d0 = pFramesOut;
      for (local_b4 = 0; local_b4 < frameCount; local_b4 = local_b4 + 1) {
        fVar1 = (float)pBQ->channels;
        iVar9 = (pBQ->b0).s32;
        iVar10 = (pBQ->b1).s32;
        iVar11 = (pBQ->b2).s32;
        iVar12 = (pBQ->a1).s32;
        iVar13 = (pBQ->a2).s32;
        for (r2 = 0.0; (uint)r2 < (uint)fVar1; r2 = (float)((int)r2 + 1)) {
          iVar14 = pBQ->pR2[(uint)r2].s32;
          iVar15 = (int)*(short *)((long)local_d8 + (ulong)(uint)r2 * 2);
          local_e4 = iVar9 * iVar15 + pBQ->pR1[(uint)r2].s32 >> 0xe;
          iVar16 = iVar12 * local_e4;
          iVar17 = iVar13 * local_e4;
          local_dc = local_e4;
          if (0x7ffe < local_e4) {
            local_dc = 0x7fff;
          }
          if (local_dc < -0x8000) {
            local_e0 = 0x8000;
          }
          else {
            if (0x7ffe < local_e4) {
              local_e4 = 0x7fff;
            }
            local_e0 = (undefined2)local_e4;
          }
          *(undefined2 *)((long)local_d0 + (ulong)(uint)r2 * 2) = local_e0;
          pBQ->pR1[(uint)r2].s32 = (iVar10 * iVar15 - iVar16) + iVar14;
          pBQ->pR2[(uint)r2].s32 = iVar11 * iVar15 - iVar17;
        }
        local_d0 = (void *)((long)local_d0 + (ulong)pBQ->channels * 2);
        local_d8 = (void *)((long)local_d8 + (ulong)pBQ->channels * 2);
      }
    }
    local_90 = MA_SUCCESS;
  }
  return local_90;
}

Assistant:

MA_API ma_result ma_biquad_process_pcm_frames(ma_biquad* pBQ, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 n;

    if (pBQ == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Note that the logic below needs to support in-place filtering. That is, it must support the case where pFramesOut and pFramesIn are the same. */

    if (pBQ->format == ma_format_f32) {
        /* */ float* pY = (      float*)pFramesOut;
        const float* pX = (const float*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_biquad_process_pcm_frame_f32__direct_form_2_transposed(pBQ, pY, pX);
            pY += pBQ->channels;
            pX += pBQ->channels;
        }
    } else if (pBQ->format == ma_format_s16) {
        /* */ ma_int16* pY = (      ma_int16*)pFramesOut;
        const ma_int16* pX = (const ma_int16*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_biquad_process_pcm_frame_s16__direct_form_2_transposed(pBQ, pY, pX);
            pY += pBQ->channels;
            pX += pBQ->channels;
        }
    } else {
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS; /* Format not supported. Should never hit this because it's checked in ma_biquad_init() and ma_biquad_reinit(). */
    }

    return MA_SUCCESS;
}